

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacket::ClearPacketList(RTCPCompoundPacket *this)

{
  list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->rtcppacklist;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    RTPDelete<jrtplib::RTCPPacket>
              ((RTCPPacket *)p_Var1[1]._M_next,(this->super_RTPMemoryObject).mgr);
  }
  std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::clear(this_00);
  (this->rtcppackit)._M_node =
       (this->rtcppacklist).
       super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  return;
}

Assistant:

void RTCPCompoundPacket::ClearPacketList()
{
	std::list<RTCPPacket *>::const_iterator it;

	for (it = rtcppacklist.begin() ; it != rtcppacklist.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	rtcppacklist.clear();
	rtcppackit = rtcppacklist.begin();
}